

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

uint If_DsdManCheckPrime(If_DsdMan_t *p,int iFirst,uint uMaskNot,If_DsdObj_t *pObj,int nSuppAll,
                        int LutSize,int fDerive,int fVerbose)

{
  int iVar1;
  int iVar2;
  int nVars;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vSets_00;
  uint local_c0;
  int Value_1;
  uint uRes;
  int Value;
  Vec_Int_t *vSets;
  int nFans;
  int truthId;
  int pFirsts [12];
  int pSSizes [12];
  int SizeOut;
  int SizeIn;
  int LimitOut;
  int set;
  int v;
  int i;
  int LutSize_local;
  int nSuppAll_local;
  If_DsdObj_t *pObj_local;
  uint uMaskNot_local;
  int iFirst_local;
  If_DsdMan_t *p_local;
  
  iVar2 = If_DsdObjTruthId(p,pObj);
  nVars = If_DsdObjFaninNum(pObj);
  vSets_00 = (Vec_Int_t *)Vec_PtrEntry(p->vTtDecs[*(uint *)&pObj->field_0x4 >> 0x1b],iVar2);
  if (fVerbose != 0) {
    printf("\n");
    Dau_DecPrintSets(vSets_00,nVars);
  }
  iVar2 = If_DsdObjFaninNum(pObj);
  if (iVar2 < 3) {
    __assert_fail("If_DsdObjFaninNum(pObj) > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x766,
                  "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  iVar2 = If_DsdObjSuppSize(pObj);
  if (iVar2 <= LutSize) {
    __assert_fail("If_DsdObjSuppSize(pObj) > LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x767,
                  "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  If_DsdManGetSuppSizes(p,pObj,pFirsts + 10);
  iVar2 = If_DsdObjSuppSize(pObj);
  iVar2 = LutSize - ((nSuppAll - iVar2) + 1);
  if (LutSize <= iVar2) {
    __assert_fail("LimitOut < LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x76a,
                  "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  set = 0;
  do {
    iVar3 = Vec_IntSize(vSets_00);
    if (iVar3 <= set) {
      return 0;
    }
    iVar3 = Vec_IntEntry(vSets_00,set);
    pSSizes[10] = 0;
    pSSizes[0xb] = 0;
    for (LimitOut = 0; LimitOut < nVars; LimitOut = LimitOut + 1) {
      uVar4 = iVar3 >> ((byte)(LimitOut << 1) & 0x1f) & 3;
      if (uVar4 == 0) {
        pSSizes[10] = pFirsts[(long)LimitOut + 10] + pSSizes[10];
      }
      else {
        if (uVar4 == 1) {
          iVar1 = pFirsts[(long)LimitOut + 10];
        }
        else {
          if (uVar4 != 3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                          ,0x77a,
                          "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                         );
          }
          iVar1 = pFirsts[(long)LimitOut + 10];
          pSSizes[10] = pFirsts[(long)LimitOut + 10] + pSSizes[10];
        }
        pSSizes[0xb] = iVar1 + pSSizes[0xb];
      }
      if ((LutSize < pSSizes[0xb]) || (iVar2 < pSSizes[10])) break;
    }
    if (LimitOut == nVars) {
      local_c0 = 0;
      if (fDerive == 0) {
        return 0xffffffff;
      }
      If_DsdManComputeFirst(p,pObj,&nFans);
      for (LimitOut = 0; LimitOut < nVars; LimitOut = LimitOut + 1) {
        uVar4 = iVar3 >> ((byte)(LimitOut << 1) & 0x1f) & 3;
        if (uVar4 != 0) {
          if (uVar4 == 1) {
            uVar4 = If_DsdSign(p,pObj,LimitOut,iFirst + (&nFans)[LimitOut],0);
          }
          else {
            if (uVar4 != 3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                            ,0x78d,
                            "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                           );
            }
            uVar4 = If_DsdSign(p,pObj,LimitOut,iFirst + (&nFans)[LimitOut],1);
          }
          local_c0 = uVar4 | local_c0;
        }
      }
      if ((local_c0 & uMaskNot) == 0) {
        return local_c0;
      }
    }
    set = set + 1;
  } while( true );
}

Assistant:

unsigned If_DsdManCheckPrime( If_DsdMan_t * p, int iFirst, unsigned uMaskNot, If_DsdObj_t * pObj, int nSuppAll, int LutSize, int fDerive, int fVerbose )
{
    int i, v, set, LimitOut, SizeIn, SizeOut, pSSizes[DAU_MAX_VAR], pFirsts[DAU_MAX_VAR];
    int truthId = If_DsdObjTruthId(p, pObj);
    int nFans = If_DsdObjFaninNum(pObj);
    Vec_Int_t * vSets = (Vec_Int_t *)Vec_PtrEntry(p->vTtDecs[pObj->nFans], truthId);
if ( fVerbose )
printf( "\n" );
if ( fVerbose )
Dau_DecPrintSets( vSets, nFans );
    assert( If_DsdObjFaninNum(pObj) > 2 );
    assert( If_DsdObjSuppSize(pObj) > LutSize );
    If_DsdManGetSuppSizes( p, pObj, pSSizes );
    LimitOut = LutSize - (nSuppAll - If_DsdObjSuppSize(pObj) + 1);
    assert( LimitOut < LutSize );
    Vec_IntForEachEntry( vSets, set, i )
    {
        SizeIn = SizeOut = 0;
        for ( v = 0; v < nFans; v++ )
        {
            int Value = ((set >> (v << 1)) & 3);
            if ( Value == 0 )
                SizeOut += pSSizes[v];
            else if ( Value == 1 )
                SizeIn += pSSizes[v];
            else if ( Value == 3 )
            {
                SizeIn += pSSizes[v];
                SizeOut += pSSizes[v];
            }
            else assert( 0 );
            if ( SizeIn > LutSize || SizeOut > LimitOut )
                break;
        }
        if ( v == nFans )
        {
            unsigned uRes = 0;
            if ( !fDerive )
                return ~0;
            If_DsdManComputeFirst( p, pObj, pFirsts );
            for ( v = 0; v < nFans; v++ )
            {
                int Value = ((set >> (v << 1)) & 3);
                if ( Value == 0 )
                {}
                else if ( Value == 1 )
                    uRes |= If_DsdSign(p, pObj, v, iFirst + pFirsts[v], 0);
                else if ( Value == 3 )
                    uRes |= If_DsdSign(p, pObj, v, iFirst + pFirsts[v], 1);
                else assert( 0 );
            }
            if ( uRes & uMaskNot )
                continue;
            return uRes;
        }
    }
    return 0;
}